

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O3

Nonnull<const_char_*> absl::lts_20250127::StatusMessageAsCStr(Status *status)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = status->rep_;
  if ((uVar1 & 1) == 0) {
    pcVar3 = *(char **)(uVar1 + 8);
    uVar1 = *(ulong *)(uVar1 + 0x10);
  }
  else {
    uVar1 = (ulong)((uint)uVar1 & 2);
    pcVar3 = "Status accessed after move.";
  }
  pcVar2 = "";
  if (uVar1 != 0) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

inline absl::string_view Status::message() const {
  return !IsInlined(rep_)
             ? RepToPointer(rep_)->message()
             : (IsMovedFrom(rep_) ? absl::string_view(kMovedFromString)
                                  : absl::string_view());
}